

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
::swap(btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
       *this,btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
             *x,allocator_type *alloc)

{
  template_ElementType<1UL> tVar1;
  int iVar2;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  *this_00;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  slot_type *psVar9;
  slot_type *psVar10;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  **ppbVar11;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  **ppbVar12;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  **ppbVar13;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar14;
  template_ElementType<1UL> *ptVar15;
  template_ElementType<1UL> *ptVar16;
  allocator_type *alloc_00;
  long lVar17;
  allocator_type *in_R9;
  btree_node<phmap::priv::map_params<int,_int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<const_int,_int>_>,_256,_false>_>
  *this_01;
  size_type i;
  
  bVar3 = leaf(this);
  bVar4 = leaf(x);
  if (bVar3 != bVar4) {
    __assert_fail("leaf() == x->leaf()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x942,
                  "void phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>>::swap(btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>]"
                 );
  }
  bVar5 = count(this);
  bVar6 = count(x);
  this_01 = x;
  this_00 = this;
  if (bVar6 < bVar5) {
    this_01 = this;
    this_00 = x;
  }
  psVar9 = slot(this_00,0);
  psVar10 = slot(this_01,0);
  bVar5 = count(this_00);
  for (lVar17 = 0; (ulong)bVar5 * 8 != lVar17; lVar17 = lVar17 + 8) {
    iVar2 = (psVar9->value).first;
    (psVar9->value).first = *(int *)((long)psVar10 + lVar17);
    *(int *)((long)psVar10 + lVar17) = iVar2;
    iVar2 = (psVar9->value).second;
    (psVar9->value).second = *(int *)((long)psVar10 + lVar17 + 4);
    *(int *)((long)psVar10 + lVar17 + 4) = iVar2;
    psVar9 = psVar9 + 1;
  }
  bVar5 = count(this_01);
  bVar6 = count(this_00);
  bVar7 = count(this_00);
  bVar8 = count(this_00);
  alloc_00 = (allocator_type *)(ulong)bVar8;
  uninitialized_move_n
            (this_01,(ulong)bVar5 - (ulong)bVar6,(ulong)bVar7,(size_type)alloc_00,this_00,in_R9);
  bVar7 = count(this_00);
  value_destroy_n(this_01,(ulong)bVar7,(ulong)bVar5 - (ulong)bVar6,alloc_00);
  bVar3 = leaf(this);
  if (!bVar3) {
    ppbVar11 = mutable_child(this_00,0);
    bVar5 = count(this_00);
    ppbVar12 = mutable_child(this_00,(ulong)bVar5 + 1);
    ppbVar13 = mutable_child(this_01,0);
    for (; ppbVar11 != ppbVar12; ppbVar11 = ppbVar11 + 1) {
      pbVar14 = *ppbVar11;
      *ppbVar11 = *ppbVar13;
      *ppbVar13 = pbVar14;
      ppbVar13 = ppbVar13 + 1;
    }
    for (i = 0; bVar5 = count(this_00), i <= bVar5; i = i + 1) {
      pbVar14 = child(this_00,i);
      set_parent(pbVar14,this_00);
      pbVar14 = child(this_01,i);
      set_parent(pbVar14,this_01);
    }
    for (; bVar5 = count(this_01), i <= bVar5; i = i + 1) {
      pbVar14 = child(this_01,i);
      init_child(this_00,(int)i,pbVar14);
      mutable_child(this_01,i);
    }
  }
  ptVar15 = btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
            ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                             *)this);
  ptVar16 = btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
            ::GetField<1ul>((btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                             *)x);
  tVar1 = ptVar15[2];
  ptVar15[2] = ptVar16[2];
  ptVar16[2] = tVar1;
  return;
}

Assistant:

void btree_node<P>::swap(btree_node *x, allocator_type *alloc) {
        using std::swap;
        assert(leaf() == x->leaf());

        // Determine which is the smaller/larger node.
        btree_node *smaller = this, *larger = x;
        if (smaller->count() > larger->count()) {
            swap(smaller, larger);
        }

        // Swap the values.
        for (slot_type *a = smaller->slot(0), *b = larger->slot(0),
                 *end = a + smaller->count();
             a != end; ++a, ++b) {
            params_type::swap(alloc, a, b);
        }

        // Move values that can't be swapped.
        const size_type to_move = larger->count() - smaller->count();
        larger->uninitialized_move_n(to_move, smaller->count(), smaller->count(),
                                     smaller, alloc);
        larger->value_destroy_n(smaller->count(), to_move, alloc);

        if (!leaf()) {
            // Swap the child pointers.
            std::swap_ranges(&smaller->mutable_child(0),
                             &smaller->mutable_child(smaller->count() + 1),
                             &larger->mutable_child(0));
            // Update swapped children's parent pointers.
            int i = 0;
            for (; i <= smaller->count(); ++i) {
                smaller->child(i)->set_parent(smaller);
                larger->child(i)->set_parent(larger);
            }
            // Move the child pointers that couldn't be swapped.
            for (; i <= larger->count(); ++i) {
                smaller->init_child(i, larger->child(i));
                larger->clear_child(i);
            }
        }

        // Swap the counts.
        swap(mutable_count(), x->mutable_count());
    }